

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O3

double VP8SSIMFromStatsClipped(VP8DistoStats *stats)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = stats->w;
  uVar6 = (ulong)stats->xm;
  iVar5 = uVar1 * uVar1;
  uVar4 = (ulong)stats->ym;
  uVar2 = uVar4 * uVar4 + uVar6 * uVar6;
  if (uVar2 < (uint)(iVar5 * 0x40)) {
    return 1.0;
  }
  lVar7 = (ulong)stats->xym * (ulong)uVar1 - uVar4 * uVar6;
  lVar3 = 0;
  if (0 < lVar7) {
    lVar3 = lVar7;
  }
  lVar7 = ((ulong)(uint)(iVar5 * 0x14) + uVar4 * uVar6 * 2) *
          ((ulong)(uint)(iVar5 * 0x3c) + lVar3 * 2 >> 8);
  lVar3 = (uVar2 + (uint)(iVar5 * 0x14)) *
          (((uint)(iVar5 * 0x3c) - uVar2) + ((ulong)stats->yym + (ulong)stats->xxm) * (ulong)uVar1
          >> 8);
  auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar8._0_8_ = lVar7;
  auVar8._12_4_ = 0x45300000;
  auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar9._0_8_ = lVar3;
  auVar9._12_4_ = 0x45300000;
  return ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
}

Assistant:

double VP8SSIMFromStatsClipped(const VP8DistoStats* const stats) {
  return SSIMCalculation(stats, stats->w);
}